

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O2

int h264_mb_type(bitstream *str,h264_cabac_context *cabac,uint32_t slice_type,uint32_t *val)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  h264_macroblock *phVar5;
  int iVar6;
  h264_cabac_se_val *tab;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  uint32_t rval;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  int local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  uint32_t uStack_40;
  
  if (cabac == (h264_cabac_context *)0x0) {
    if (4 < slice_type) {
      abort();
    }
    uVar7 = *(uint *)(&DAT_00128b58 + (ulong)slice_type * 4);
    uVar3 = *(uint *)(&DAT_00128b6c + (ulong)slice_type * 4);
    if (str->dir == VS_ENCODE) {
      uVar4 = *val;
      iVar6 = -uVar3;
      if (uVar7 <= uVar4 || uVar4 < uVar3) {
        if (0x19 < uVar4) goto LAB_001082ff;
        iVar6 = uVar7 - uVar3;
      }
      rval = uVar4 + iVar6;
    }
    iVar6 = vs_ue(str,&rval);
    if (iVar6 != 0) {
      return 1;
    }
    if (str->dir != VS_DECODE) {
      return 0;
    }
    uVar7 = uVar7 - uVar3;
    if ((rval < uVar7) || (uVar3 = -uVar7, rval < uVar7 + 0x1a)) {
      *val = rval + uVar3;
      return 0;
    }
LAB_001082ff:
    fwrite("Invalid mb_type for this slice_type\n",0x24,1,_stderr);
    return 1;
  }
  phVar5 = h264_mb_nb(cabac->slice,H264_MB_A,0);
  uVar1 = phVar5->mb_type;
  phVar5 = h264_mb_nb(cabac->slice,H264_MB_B,0);
  if (4 < slice_type) {
    return 0;
  }
  uVar2 = phVar5->mb_type;
  switch(slice_type) {
  default:
    local_4c = 0xe;
    uStack_48 = 0xf;
    uStack_44 = 0x10;
    uStack_40 = 0x11;
    rval = 0x11;
    local_60 = 0x12;
    uStack_5c = 0x13;
    uStack_58 = 0x13;
    uStack_54 = 0x14;
    tab = mb_type_p;
    local_50 = 0x14;
    goto LAB_001082c1;
  case 1:
    local_4c = 0x1b;
    if (uVar1 - 0x3a < 0xfffffffe) {
      local_4c = (uVar1 != 0x21) + 0x1b;
    }
    local_4c = (uint)(uVar2 != 0x21 && uVar2 - 0x3a < 0xfffffffe) + local_4c;
    uStack_48 = 0x1e;
    uStack_44 = 0x1f;
    rval = 0x20;
    local_60 = 0x21;
    uStack_5c = 0x22;
    uStack_58 = 0x22;
    uStack_54 = 0x23;
    tab = mb_type_b;
    local_50 = 0x23;
    uStack_40 = rval;
    goto LAB_001082c1;
  case 2:
    iVar6 = (uint)(uVar2 != 0 && uVar2 != 0x39) + (uint)(uVar1 != 0 && uVar1 != 0x39);
    tab = mb_type_i;
    break;
  case 4:
    bVar8 = uVar1 != 0x1a && uVar1 != 0x39;
    bVar9 = uVar2 != 0x1a && uVar2 != 0x39;
    local_4c = (uint)bVar9 + (uint)bVar8;
    iVar6 = (uint)(bVar9 && uVar2 != 0) + (uint)(bVar8 && uVar1 != 0);
    tab = mb_type_si;
  }
  rval = iVar6 + 3;
  uStack_54 = 9;
  uStack_58 = 8;
  uStack_5c = 7;
  local_60 = 6;
  local_50 = 10;
LAB_001082c1:
  local_64 = 0x114;
  h264_cabac_se(str,cabac,tab,(int *)&rval,val);
  return 0;
}

Assistant:

int h264_mb_type(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t slice_type, uint32_t *val) {
	if (!cabac) {
		uint32_t rval;
		int rstart;
		int rend;
		switch (slice_type) {
			case H264_SLICE_TYPE_I:
				rstart = 0;
				rend = 0;
				break;
			case H264_SLICE_TYPE_SI:
				rstart = H264_MB_TYPE_SI_BASE;
				rend = H264_MB_TYPE_SI_END;
				break;
			case H264_SLICE_TYPE_P:
			case H264_SLICE_TYPE_SP:
				rstart = H264_MB_TYPE_P_BASE;
				rend = H264_MB_TYPE_P_SKIP;
				break;
			case H264_SLICE_TYPE_B:
				rstart = H264_MB_TYPE_B_BASE;
				rend = H264_MB_TYPE_B_SKIP;
				break;
			default:
				abort();
		}
		if (str->dir == VS_ENCODE) {
			if (*val >= rstart && *val < rend) {
				rval = *val - rstart;
			} else if (*val < H264_MB_TYPE_I_END) {
				rval = *val + rend - rstart;
			} else {
				fprintf (stderr, "Invalid mb_type for this slice_type\n");
				return 1;
			}
		}
		if (vs_ue(str, &rval))
			return 1;
		if (str->dir == VS_DECODE) {
			if (rval < rend - rstart) {
				*val = rval + rstart;
			} else if (rval < rend - rstart + H264_MB_TYPE_I_END) {
				*val = rval - (rend - rstart);
			} else {
				fprintf (stderr, "Invalid mb_type for this slice_type\n");
				return 1;
			}
		}
	} else {
		int bidx[11];
		uint32_t mbtA = h264_mb_nb(cabac->slice, H264_MB_A, 0)->mb_type;
		uint32_t mbtB = h264_mb_nb(cabac->slice, H264_MB_B, 0)->mb_type;
		int condTermFlagA = mbtA != H264_MB_TYPE_UNAVAIL;
		int condTermFlagB = mbtB != H264_MB_TYPE_UNAVAIL;
		switch (slice_type) {
			case H264_SLICE_TYPE_SI:
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_SI;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_SI;
				bidx[7] = H264_CABAC_CTXIDX_MB_TYPE_SI_PRE + condTermFlagA + condTermFlagB;
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_I_NXN;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_I_NXN;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_I + condTermFlagA + condTermFlagB;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_I + 3;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_I + 4;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_I + 5;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_I + 6;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_I + 7;
				h264_cabac_se(str, cabac, mb_type_si, bidx, val);
				break;
			case H264_SLICE_TYPE_I:
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_I_NXN;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_I_NXN;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_I + condTermFlagA + condTermFlagB;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_I + 3;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_I + 4;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_I + 5;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_I + 6;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_I + 7;
				h264_cabac_se(str, cabac, mb_type_i, bidx, val);
				break;
			case H264_SLICE_TYPE_P:
			case H264_SLICE_TYPE_SP:
				bidx[7] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 0;
				bidx[8] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 1;
				bidx[9] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 2;
				bidx[10] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 3;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 0;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 1;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 2;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 2;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 3;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 3;
				h264_cabac_se(str, cabac, mb_type_p, bidx, val);
				break;
			case H264_SLICE_TYPE_B:
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_B_SKIP && mbtA != H264_MB_TYPE_B_DIRECT_16X16;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_B_SKIP && mbtB != H264_MB_TYPE_B_DIRECT_16X16;
				bidx[7] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + condTermFlagA + condTermFlagB;
				bidx[8] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + 3;
				bidx[9] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + 4;
				bidx[10] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + 5;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 0;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 1;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 2;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 2;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 3;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 3;
				h264_cabac_se(str, cabac, mb_type_b, bidx, val);
				break;
		}
	}
	return 0;
}